

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3sLongShaderTests.cpp
# Opt level: O0

void __thiscall
deqp::gles3::Stress::LongShaderCompileStressCase::~LongShaderCompileStressCase
          (LongShaderCompileStressCase *this)

{
  LongShaderCompileStressCase *this_local;
  
  (this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__LongShaderCompileStressCase_015b50d0;
  anon_unknown_0::LongShaderGenerator::~LongShaderGenerator(&this->m_gen);
  de::Random::~Random(&this->m_rnd);
  TestCase::~TestCase(&this->super_TestCase);
  return;
}

Assistant:

LongShaderCompileStressCase::~LongShaderCompileStressCase (void)
{
}